

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O2

bool cppcms::http::protocol::separator(char c)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,c);
  uVar2 = iVar1 - 9;
  if (((0x37 < uVar2) || ((0xfe004982800001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
     ((uVar2 = iVar1 - 0x5b, 0x22 < uVar2 || ((0x500000007U >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

inline bool separator(char c)
	{
		switch(c) {
		case '(':
		case ')':
		case '<':
		case '>':
		case '@':
		case ',':
		case ';':
		case ':':
		case '\\':
		case '"':
		case '/':
		case '[':
		case ']':
		case '?':
		case '=':
		case '{':
		case '}':
		case ' ':
		case '\t':
			return true;
		default:
			return false;
		}
	}